

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_subgraph.cpp
# Opt level: O1

void __thiscall Adjacency_Subgraph_swap_Test::TestBody(Adjacency_Subgraph_swap_Test *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  pointer puVar9;
  pointer puVar10;
  pointer puVar11;
  pointer puVar12;
  size_t sVar13;
  char *pcVar14;
  char *pcVar15;
  pointer *__ptr;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  Adjacency_Subgraph subgraph_1;
  Adjacency_Graph<false> graph_1;
  Adjacency_Graph<false> graph_0;
  Adjacency_Subgraph subgraph_0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_300;
  undefined1 local_2f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  undefined1 local_2d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d0;
  pointer local_2c8;
  AssertHelper local_2c0;
  Adjacency_Subgraph local_2b8;
  Adjacency_Graph<false> local_250;
  Adjacency_Graph<false> local_220;
  Adjacency_Subgraph local_1f0;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  local_1f0.hash_parent = 0;
  local_1f0.graph.vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&DAT_00000006;
  local_1f0.graph.vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1f0.graph.vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&DAT_00000008;
  local_1f0.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  local_1f0.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&DAT_00000007;
  local_1f0.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  local_1f0.i_local_global.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)&DAT_00000008;
  local_1f0.i_local_global.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x1;
  local_1f0.i_local_global.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_0000000a;
  local_1f0.level_set_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
  local_1f0.level_set_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0xc;
  local_1f0.level_set_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
  local_188 = 6;
  local_180 = 2;
  local_178 = 7;
  local_170 = 2;
  local_168 = 9;
  local_160 = 3;
  pcVar15 = (char *)0xb;
  local_158 = 0xb;
  local_150 = 3;
  local_148 = 0xc;
  local_140 = 3;
  local_138 = 0xe;
  local_130 = 4;
  local_128 = 9;
  local_120 = 4;
  local_118 = 10;
  local_110 = 4;
  local_108 = 0xb;
  local_100 = 4;
  local_f8 = 0xd;
  local_f0 = 5;
  local_e8 = 0xd;
  local_e0 = 5;
  local_d8 = 0xe;
  local_d0 = 6;
  local_c8 = 7;
  local_c0 = 6;
  local_b8 = 8;
  local_b0 = 7;
  local_a8 = 8;
  local_a0 = 7;
  local_98 = 9;
  local_90 = 7;
  local_88 = 10;
  local_80 = 9;
  local_78 = 10;
  local_70 = 10;
  local_68 = 0xb;
  local_60 = 10;
  local_58 = 0xc;
  local_50 = 0xb;
  local_48 = 0xc;
  local_40 = 0xb;
  local_38 = 0xd;
  local_30 = 0xb;
  local_28 = 0xe;
  local_20 = 0xd;
  local_18 = 0xe;
  edge_graph._M_len = 0x1e;
  edge_graph._M_array = (iterator)&local_1f0;
  Disa::Adjacency_Graph<false>::Adjacency_Graph(&local_220,edge_graph);
  Disa::create_graph_structured<false>(&local_250,3);
  local_2b8.graph.vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&DAT_00000008;
  local_2b8.graph.vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x1;
  local_2b8.hash_parent = 0;
  local_2b8.graph.vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&DAT_00000006;
  local_2b8.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_00000007;
  __l._M_len = 5;
  __l._M_array = &local_2b8.hash_parent;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f8,__l,
             (allocator_type *)local_2d8);
  Disa::Adjacency_Subgraph::Adjacency_Subgraph
            (&local_1f0,&local_220,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2f8,0);
  if (local_2f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2f8,local_2e8._M_allocated_capacity - (long)local_2f8);
  }
  local_2e8._M_allocated_capacity = (size_type)&DAT_00000007;
  local_2e8._8_8_ = 8;
  local_2f8 = (undefined1  [8])&DAT_00000004;
  pbStack_2f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000005;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)local_2f8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8,__l_00,
             (allocator_type *)&local_300);
  Disa::Adjacency_Subgraph::Adjacency_Subgraph
            (&local_2b8,&local_250,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8,0);
  if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_2d8 !=
      (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    operator_delete((void *)local_2d8,(long)local_2c8 - (long)local_2d8);
  }
  puVar12 = local_1f0.level_set_value.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  puVar11 = local_1f0.level_set_value.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
  puVar10 = local_1f0.level_set_value.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar9 = local_1f0.i_local_global.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar8 = local_1f0.i_local_global.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar7 = local_1f0.i_local_global.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = local_1f0.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar5 = local_1f0.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  puVar4 = local_1f0.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = local_1f0.graph.vertex_adjacent_list.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar2 = local_1f0.graph.vertex_adjacent_list.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar1 = local_1f0.graph.vertex_adjacent_list.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar13 = local_1f0.hash_parent;
  local_1f0.graph.vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = local_2b8.graph.vertex_adjacent_list.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_1f0.graph.vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_2b8.graph.vertex_adjacent_list.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_1f0.graph.vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_2b8.graph.vertex_adjacent_list.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_2b8.graph.vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar1;
  local_2b8.graph.vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar2;
  local_2b8.graph.vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar3;
  local_1f0.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_2b8.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1f0.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_2b8.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_1f0.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_2b8.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2b8.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = puVar4;
  local_2b8.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar5;
  local_2b8.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar6;
  local_1f0.i_local_global.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start =
       local_2b8.i_local_global.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1f0.i_local_global.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_finish =
       local_2b8.i_local_global.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_1f0.i_local_global.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       local_2b8.i_local_global.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2b8.i_local_global.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start = puVar7;
  local_2b8.i_local_global.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_finish = puVar8;
  local_2b8.i_local_global.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = puVar9;
  local_1f0.level_set_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_2b8.level_set_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1f0.level_set_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_2b8.level_set_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_1f0.level_set_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_2b8.level_set_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2b8.level_set_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = puVar10;
  local_2b8.level_set_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar11;
  local_2b8.level_set_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar12;
  local_1f0.hash_parent = local_2b8.hash_parent;
  local_2b8.hash_parent = sVar13;
  sVar13 = std::hash<Disa::Adjacency_Graph<false>_>::operator()
                     ((hash<Disa::Adjacency_Graph<false>_> *)local_2f8,&local_250);
  local_2d8[0] = sVar13 == local_1f0.hash_parent;
  local_2d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (sVar13 != local_1f0.hash_parent) {
    testing::Message::Message((Message *)&local_300);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2f8,(internal *)local_2d8,
               (AssertionResult *)"subgraph_0.is_parent(graph_1)","false","true",pcVar15);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x10d,(char *)local_2f8);
    testing::internal::AssertHelper::operator=(&local_2c0,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    if (local_2f8 != (undefined1  [8])&local_2e8) {
      operator_delete((void *)local_2f8,(ulong)(local_2e8._M_allocated_capacity + 1));
    }
    if (local_300._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_300._M_head_impl + 8))();
    }
  }
  if (local_2d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d0,local_2d0);
  }
  local_2d8 = (undefined1  [8])
              (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0;
  if (local_1f0.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1f0.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_2d8 = (undefined1  [8])
                (((long)local_1f0.graph.offset.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_1f0.graph.offset.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) + -1);
  }
  local_300._M_head_impl._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2f8,"subgraph_0.size_vertex()","4",(unsigned_long *)local_2d8,
             (int *)&local_300);
  if (local_2f8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if (pbStack_2f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (pbStack_2f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x10e,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if (pbStack_2f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2f0,pbStack_2f0);
  }
  local_2d8 = (undefined1  [8])
              ((ulong)((long)local_1f0.graph.vertex_adjacent_list.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_1f0.graph.vertex_adjacent_list.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) >> 1);
  local_300._M_head_impl._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2f8,"subgraph_0.size_edge()","4",(unsigned_long *)local_2d8,
             (int *)&local_300);
  if (local_2f8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if (pbStack_2f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (pbStack_2f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x10f,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if (pbStack_2f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2f0,pbStack_2f0);
  }
  local_300._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_1f0,(size_t *)&local_300);
  local_2c0.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2f8,"subgraph_0.local_global(0)","4",(unsigned_long *)local_2d8,
             (int *)&local_2c0);
  if (local_2f8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if (pbStack_2f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (pbStack_2f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x110,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if (pbStack_2f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2f0,pbStack_2f0);
  }
  local_300._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_1f0,(size_t *)&local_300);
  local_2c0.data_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2f8,"subgraph_0.local_global(1)","5",(unsigned_long *)local_2d8,
             (int *)&local_2c0);
  if (local_2f8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if (pbStack_2f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (pbStack_2f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x111,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if (pbStack_2f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2f0,pbStack_2f0);
  }
  local_300._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_1f0,(size_t *)&local_300);
  local_2c0.data_._0_4_ = 7;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2f8,"subgraph_0.local_global(2)","7",(unsigned_long *)local_2d8,
             (int *)&local_2c0);
  if (local_2f8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if (pbStack_2f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (pbStack_2f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x112,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if (pbStack_2f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2f0,pbStack_2f0);
  }
  local_300._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_1f0,(size_t *)&local_300);
  local_2c0.data_._0_4_ = 8;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2f8,"subgraph_0.local_global(3)","8",(unsigned_long *)local_2d8,
             (int *)&local_2c0);
  if (local_2f8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if (pbStack_2f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (pbStack_2f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x113,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if (pbStack_2f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2f0,pbStack_2f0);
  }
  sVar13 = std::hash<Disa::Adjacency_Graph<false>_>::operator()
                     ((hash<Disa::Adjacency_Graph<false>_> *)local_2f8,&local_220);
  local_2d8[0] = sVar13 == local_2b8.hash_parent;
  local_2d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (sVar13 != local_2b8.hash_parent) {
    testing::Message::Message((Message *)&local_300);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2f8,(internal *)local_2d8,
               (AssertionResult *)"subgraph_1.is_parent(graph_0)","false","true",pcVar15);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x115,(char *)local_2f8);
    testing::internal::AssertHelper::operator=(&local_2c0,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    if (local_2f8 != (undefined1  [8])&local_2e8) {
      operator_delete((void *)local_2f8,(ulong)(local_2e8._M_allocated_capacity + 1));
    }
    if (local_300._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_300._M_head_impl + 8))();
    }
  }
  if (local_2d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_2d0,local_2d0);
  }
  local_2d8 = (undefined1  [8])
              (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0;
  if (local_2b8.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_2b8.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_2d8 = (undefined1  [8])
                (((long)local_2b8.graph.offset.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_2b8.graph.offset.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) + -1);
  }
  local_300._M_head_impl._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2f8,"subgraph_1.size_vertex()","5",(unsigned_long *)local_2d8,
             (int *)&local_300);
  if (local_2f8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if (pbStack_2f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (pbStack_2f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x116,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if (pbStack_2f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2f0,pbStack_2f0);
  }
  local_2d8 = (undefined1  [8])
              ((ulong)((long)local_2b8.graph.vertex_adjacent_list.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_2b8.graph.vertex_adjacent_list.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) >> 1);
  local_300._M_head_impl._0_4_ = 7;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2f8,"subgraph_1.size_edge()","7",(unsigned_long *)local_2d8,
             (int *)&local_300);
  if (local_2f8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if (pbStack_2f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (pbStack_2f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x117,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if (pbStack_2f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2f0,pbStack_2f0);
  }
  local_300._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_2b8,(size_t *)&local_300);
  local_2c0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2f8,"subgraph_1.local_global(0)","0",(unsigned_long *)local_2d8,
             (int *)&local_2c0);
  if (local_2f8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if (pbStack_2f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (pbStack_2f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x118,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if (pbStack_2f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2f0,pbStack_2f0);
  }
  local_300._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_2b8,(size_t *)&local_300);
  local_2c0.data_._0_4_ = 6;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2f8,"subgraph_1.local_global(1)","6",(unsigned_long *)local_2d8,
             (int *)&local_2c0);
  if (local_2f8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if (pbStack_2f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (pbStack_2f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x119,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if (pbStack_2f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2f0,pbStack_2f0);
  }
  local_300._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_2b8,(size_t *)&local_300);
  local_2c0.data_._0_4_ = 8;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2f8,"subgraph_1.local_global(2)","8",(unsigned_long *)local_2d8,
             (int *)&local_2c0);
  if (local_2f8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if (pbStack_2f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (pbStack_2f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x11a,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if (pbStack_2f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2f0,pbStack_2f0);
  }
  local_300._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_2b8,(size_t *)&local_300);
  local_2c0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2f8,"subgraph_1.local_global(3)","1",(unsigned_long *)local_2d8,
             (int *)&local_2c0);
  if (local_2f8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if (pbStack_2f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (pbStack_2f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x11b,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if (pbStack_2f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2f0,pbStack_2f0);
  }
  local_300._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_2b8,(size_t *)&local_300);
  local_2c0.data_._0_4_ = 7;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2f8,"subgraph_1.local_global(4)","7",(unsigned_long *)local_2d8,
             (int *)&local_2c0);
  if (local_2f8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if (pbStack_2f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = (pbStack_2f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x11c,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_300,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_300);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if (pbStack_2f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2f0,pbStack_2f0);
  }
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph(&local_2b8);
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph(&local_1f0);
  Disa::Adjacency_Graph<false>::~Adjacency_Graph(&local_250);
  Disa::Adjacency_Graph<false>::~Adjacency_Graph(&local_220);
  return;
}

Assistant:

TEST(Adjacency_Subgraph, swap) {
  Adjacency_Graph<false> graph_0 = create_graph_saad();
  Adjacency_Graph<false> graph_1 = create_graph_structured<false>(3);
  Adjacency_Subgraph subgraph_0(graph_0, {0, 6, 8, 1, 7});
  Adjacency_Subgraph subgraph_1(graph_1, {4, 5, 7, 8});

  subgraph_0.swap(subgraph_1);
  EXPECT_TRUE(subgraph_0.is_parent(graph_1));
  EXPECT_EQ(subgraph_0.size_vertex(), 4);
  EXPECT_EQ(subgraph_0.size_edge(), 4);
  EXPECT_EQ(subgraph_0.local_global(0), 4);
  EXPECT_EQ(subgraph_0.local_global(1), 5);
  EXPECT_EQ(subgraph_0.local_global(2), 7);
  EXPECT_EQ(subgraph_0.local_global(3), 8);

  EXPECT_TRUE(subgraph_1.is_parent(graph_0));
  EXPECT_EQ(subgraph_1.size_vertex(), 5);
  EXPECT_EQ(subgraph_1.size_edge(), 7);
  EXPECT_EQ(subgraph_1.local_global(0), 0);
  EXPECT_EQ(subgraph_1.local_global(1), 6);
  EXPECT_EQ(subgraph_1.local_global(2), 8);
  EXPECT_EQ(subgraph_1.local_global(3), 1);
  EXPECT_EQ(subgraph_1.local_global(4), 7);
}